

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibraryinfo.cpp
# Opt level: O0

unique_ptr<QSettings,_std::default_delete<QSettings>_> findConfiguration(void)

{
  bool bVar1;
  QArrayDataPointer<char16_t> *this;
  __uniq_ptr_data<QSettings,_std::default_delete<QSettings>,_true,_true> in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_const_char16_t_(&)[9]> QVar2;
  char16_t *str;
  QString pwd;
  QString qtconfig;
  QStringBuilder<QString_&,_QString> *in_stack_fffffffffffffe58;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffe60;
  QString *in_stack_fffffffffffffe68;
  size_t in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  QLocale *in_stack_fffffffffffffe80;
  QString *in_stack_fffffffffffffe88;
  QResource *in_stack_fffffffffffffe90;
  undefined1 local_50 [16];
  QArrayDataPointer<char16_t> local_40;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((anonymous_namespace)::qtconfManualPath != 0) {
    local_c = 1;
    std::make_unique<QSettings,QString_const&,QSettings::Format>
              (in_stack_fffffffffffffe88,(Format *)in_stack_fffffffffffffe80);
    goto LAB_002389d5;
  }
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  this = &local_40;
  QArrayDataPointer<char16_t>::QArrayDataPointer(this,(Data *)0x0,L":/qt/etc/qt.conf",0x10);
  QString::QString((QString *)in_stack_fffffffffffffe60,(DataPointer *)in_stack_fffffffffffffe58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffe60);
  QLocale::c(local_50,this);
  QResource::QResource
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  bVar1 = QResource::isValid((QResource *)in_stack_fffffffffffffe60);
  QResource::~QResource((QResource *)0x23864a);
  QLocale::~QLocale((QLocale *)0x238657);
  if (bVar1) {
    std::make_unique<QSettings,QString&,QSettings::Format>
              (in_stack_fffffffffffffe88,(Format *)in_stack_fffffffffffffe80);
  }
  else {
    bVar1 = QCoreApplication::instanceExists();
    if (bVar1) {
      QCoreApplication::applicationDirPath();
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                 in_stack_fffffffffffffe70);
      operator+(in_stack_fffffffffffffe68,(QString *)in_stack_fffffffffffffe60);
      QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffe58);
      QString::operator=((QString *)in_stack_fffffffffffffe60,(QString *)in_stack_fffffffffffffe58);
      QString::~QString((QString *)0x2387dc);
      QStringBuilder<QString_&,_QString>::~QStringBuilder
                ((QStringBuilder<QString_&,_QString> *)0x2387e9);
      QString::~QString((QString *)0x2387f6);
      bVar1 = QFile::exists((QString *)0x238800);
      if (bVar1) {
        std::make_unique<QSettings,QString&,QSettings::Format>
                  (in_stack_fffffffffffffe88,(Format *)in_stack_fffffffffffffe80);
        bVar1 = true;
      }
      else {
        QVar2 = operator+((QString *)in_stack_fffffffffffffe60,
                          (char16_t (*) [9])in_stack_fffffffffffffe58);
        QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QString_&,_const_char16_t_(&)[9]> *)in_stack_fffffffffffffe58);
        QString::operator=((QString *)in_stack_fffffffffffffe60,(QString *)in_stack_fffffffffffffe58
                          );
        QString::~QString((QString *)0x238926);
        bVar1 = QFile::exists((QString *)0x238930);
        if (bVar1) {
          std::make_unique<QSettings,QString&,QSettings::Format>(QVar2.a,(Format *)QVar2.b);
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
      }
      QString::~QString((QString *)0x238986);
      if (bVar1) goto LAB_002389b7;
    }
    std::unique_ptr<QSettings,std::default_delete<QSettings>>::
    unique_ptr<std::default_delete<QSettings>,void>
              ((unique_ptr<QSettings,_std::default_delete<QSettings>_> *)in_stack_fffffffffffffe60,
               in_stack_fffffffffffffe58);
  }
LAB_002389b7:
  QString::~QString((QString *)0x2389c4);
LAB_002389d5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<QSettings,_std::default_delete<QSettings>,_true,_true>)
         (tuple<QSettings_*,_std::default_delete<QSettings>_>)
         in_RDI.super___uniq_ptr_impl<QSettings,_std::default_delete<QSettings>_>._M_t.
         super__Tuple_impl<0UL,_QSettings_*,_std::default_delete<QSettings>_>.
         super__Head_base<0UL,_QSettings_*,_false>._M_head_impl;
}

Assistant:

static std::unique_ptr<QSettings> findConfiguration()
{
    if (qtconfManualPath)
        return std::make_unique<QSettings>(*qtconfManualPath, QSettings::IniFormat);

    QString qtconfig = QStringLiteral(":/qt/etc/qt.conf");
    if (QResource(qtconfig, QLocale::c()).isValid())
        return std::make_unique<QSettings>(qtconfig, QSettings::IniFormat);
#ifdef Q_OS_DARWIN
    CFBundleRef bundleRef = CFBundleGetMainBundle();
    if (bundleRef) {
        QCFType<CFURLRef> urlRef = CFBundleCopyResourceURL(bundleRef,
                                                           QCFString("qt.conf"_L1),
                                                           0,
                                                           0);
        if (urlRef) {
            QCFString path = CFURLCopyFileSystemPath(urlRef, kCFURLPOSIXPathStyle);
            qtconfig = QDir::cleanPath(path);
            if (QFile::exists(qtconfig))
                return std::make_unique<QSettings>(qtconfig, QSettings::IniFormat);
        }
    }
#endif
    if (QCoreApplication::instanceExists()) {
        QString pwd = QCoreApplication::applicationDirPath();
        qtconfig = pwd + u"/qt" QT_STRINGIFY(QT_VERSION_MAJOR) ".conf"_s;
        if (QFile::exists(qtconfig))
            return std::make_unique<QSettings>(qtconfig, QSettings::IniFormat);
        qtconfig = pwd + u"/qt.conf";
        if (QFile::exists(qtconfig))
            return std::make_unique<QSettings>(qtconfig, QSettings::IniFormat);
    }
    return nullptr;     //no luck
}